

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>
::ComputeViolations(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>
                    *this,SolCheck *chk)

{
  char cVar1;
  _Map_pointer ppCVar2;
  _Elt_pointer pCVar3;
  _Alloc_hider _Var4;
  int iVar5;
  long lVar6;
  char *__s;
  mapped_type *pmVar7;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  Container *pCVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  double dVar18;
  ulong extraout_XMM0_Qb;
  double dVar19;
  double dVar20;
  Violation VVar21;
  allocator<char> local_79;
  double local_78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
  *local_70;
  key_type local_68;
  double local_48;
  ulong uStack_40;
  
  ppCVar2 = (this->cons_).
            super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar6 = ((long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 6) +
          ((long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 6) +
          ((long)ppCVar2 +
           ((ulong)(ppCVar2 != (_Map_pointer)0x0) * -8 -
           (long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node) & 0xfffffffffffffff8);
  if ((lVar6 != 0) && (iVar5 = (int)lVar6, iVar5 != 0)) {
    local_70 = &chk->viol_cons_alg_;
    lVar6 = (long)iVar5;
    pmVar7 = (mapped_type *)0x0;
    lVar17 = lVar6 << 6;
    do {
      lVar6 = lVar6 + -1;
      pCVar3 = (this->cons_).
               super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppCVar2 = (this->cons_).
                super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      lVar15 = (long)pCVar3 -
               (long)(this->cons_).
                     super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
      uVar10 = lVar6 + lVar15;
      uVar9 = (uint)uVar10;
      uVar11 = (long)uVar10 >> 3;
      if ((long)uVar10 < 0) {
        lVar12 = *(long *)((long)ppCVar2 + (uVar10 & 0xfffffffffffffff8));
        if (*(char *)(lVar12 + 0x39 + (ulong)((uVar9 & 7) << 6)) == '\0') {
          cVar1 = *(char *)(lVar12 + 0x38 + (ulong)((uVar9 & 7) << 6));
          uVar16 = uVar11;
LAB_00221458:
          pCVar13 = ppCVar2[uVar16] + lVar15 + uVar16 * -8 + lVar6;
LAB_00221471:
          uVar14 = (uint)(cVar1 == '\0') << 3;
          uVar9 = uVar14 | 2;
          if (pCVar13->depth_ != 0) {
            uVar9 = uVar14;
          }
          if (uVar9 == 0) {
            uVar9 = 4;
          }
          if ((chk->check_mode_ & uVar9) != 0) {
            if ((long)uVar10 < 0) {
LAB_002214b7:
              pCVar13 = ppCVar2[uVar11] + lVar15 + uVar11 * -8 + lVar6;
            }
            else {
              if (7 < uVar10) {
                uVar11 = uVar10 >> 3;
                goto LAB_002214b7;
              }
              pCVar13 = (Container *)
                        ((long)&(((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
                                   *)(&pCVar3[-1].con_.con_flat_.
                                       super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::ExpId>
                                     + -5))->super_FunctionalConstraint).super_BasicConstraint.name_
                        + lVar17);
            }
            VVar21 = ComputeViolation<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::ExpId,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                               ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
                                 *)pCVar13,&chk->x_);
            dVar19 = VVar21.valX_;
            dVar18 = VVar21.viol_;
            if (chk->feastol_ <= dVar18 && dVar18 != chk->feastol_) {
              dVar20 = 0.0;
              uVar10 = 0;
              if ((dVar19 != 0.0) || (NAN(dVar19))) {
                dVar20 = ABS(dVar18 / dVar19);
                uVar10 = extraout_XMM0_Qb & 0x7fffffffffffffff;
                if (dVar20 < chk->feastolrel_ || dVar20 == chk->feastolrel_) goto LAB_0022161a;
              }
              if (pmVar7 == (mapped_type *)0x0) {
                local_78 = dVar18;
                local_48 = dVar20;
                uStack_40 = uVar10;
                __s = BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_68,__s,&local_79);
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                         ::operator[](local_70,&local_68);
                dVar18 = local_78;
                dVar20 = local_48;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  operator_delete(local_68._M_dataplus._M_p,
                                  local_68.field_2._M_allocated_capacity + 1);
                  dVar18 = local_78;
                  dVar20 = local_48;
                }
              }
              lVar15 = 2 - (ulong)((uVar9 & 0xfffffff8) == 0);
              if ((uVar9 & 2) != 0) {
                lVar15 = 0;
              }
              pCVar3 = (this->cons_).
                       super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              lVar12 = (long)pCVar3 -
                       (long)(this->cons_).
                             super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
              uVar10 = lVar6 + lVar12;
              if ((long)uVar10 < 0) {
                uVar10 = (long)uVar10 >> 3;
LAB_002215ce:
                pCVar13 = (this->cons_).
                          super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>::Container>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] +
                          lVar12 + uVar10 * -8 + lVar6;
              }
              else {
                if (7 < uVar10) {
                  uVar10 = uVar10 >> 3;
                  goto LAB_002215ce;
                }
                pCVar13 = (Container *)
                          ((long)&(((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
                                     *)(&pCVar3[-1].con_.con_flat_.
                                         super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::ExpId>
                                       + -5))->super_FunctionalConstraint).super_BasicConstraint.
                                  name_ + lVar17);
              }
              piVar8 = &pmVar7->_M_elems[0].N_ + (lVar15 * 5 & 0xffffffffU) * 2;
              _Var4._M_p = (pCVar13->con_).con_flat_.super_FunctionalConstraint.
                           super_BasicConstraint.name_._M_dataplus._M_p;
              *piVar8 = *piVar8 + 1;
              if (*(double *)(piVar8 + 2) <= dVar18 && dVar18 != *(double *)(piVar8 + 2)) {
                *(double *)(piVar8 + 2) = dVar18;
                *(pointer *)(piVar8 + 4) = _Var4._M_p;
              }
              if (*(double *)(piVar8 + 6) <= dVar20 && dVar20 != *(double *)(piVar8 + 6)) {
                *(double *)(piVar8 + 6) = dVar20;
                *(pointer *)(piVar8 + 8) = _Var4._M_p;
              }
            }
          }
        }
      }
      else if (uVar10 < 8) {
        if (*(char *)((long)(&pCVar3[-1].con_ + 1) + lVar17 + 9) == '\0') {
          pCVar13 = (Container *)
                    ((long)&(((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
                               *)(&pCVar3[-1].con_.con_flat_.
                                   super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::ExpId>
                                 + -5))->super_FunctionalConstraint).super_BasicConstraint.name_ +
                    lVar17);
          cVar1 = *(char *)((long)(&pCVar3[-1].con_ + 1) + lVar17 + 8);
          goto LAB_00221471;
        }
      }
      else {
        lVar12 = *(long *)((long)ppCVar2 + (uVar10 & 0xfffffffffffffff8));
        if (*(char *)(lVar12 + 0x39 + (ulong)((uVar9 & 7) << 6)) == '\0') {
          cVar1 = *(char *)(lVar12 + 0x38 + (ulong)((uVar9 & 7) << 6));
          uVar16 = uVar10 >> 3;
          goto LAB_00221458;
        }
      }
LAB_0022161a:
      lVar17 = lVar17 + -0x40;
    } while (lVar6 != 0);
  }
  return;
}

Assistant:

const FlatExprType& GetExpr() const { return con_; }